

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::GetCapitalizedType_abi_cxx11_
                   (FieldDescriptor *field)

{
  Type TVar1;
  string *in_RDI;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  LogMessage *this;
  undefined8 in_stack_fffffffffffffed8;
  LogLevel level;
  LogMessage *in_stack_fffffffffffffee0;
  allocator *paVar2;
  LogMessage local_70;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11 [17];
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  TVar1 = FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffffee0);
  switch(TVar1) {
  case TYPE_DOUBLE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Double",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case TYPE_FLOAT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Float",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case TYPE_INT64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Int64",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case TYPE_UINT64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"UInt64",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case TYPE_INT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Int32",local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
    break;
  case TYPE_FIXED64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Fixed64",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  case TYPE_FIXED32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Fixed32",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case TYPE_BOOL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Bool",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  case TYPE_STRING:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"String",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  case TYPE_GROUP:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Group",&local_34);
    std::allocator<char>::~allocator((allocator<char> *)&local_34);
    break;
  case TYPE_MESSAGE:
    paVar2 = &local_35;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Message",paVar2);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
    break;
  case TYPE_BYTES:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Bytes",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
    break;
  case TYPE_UINT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"UInt32",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case TYPE_ENUM:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Enum",&local_33);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
    break;
  case TYPE_SFIXED32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"SFixed32",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case TYPE_SFIXED64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"SFixed64",&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    break;
  case TYPE_SINT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"SInt32",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case MAX_TYPE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"SInt64",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  default:
    this = &local_70;
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffee0,level,(char *)this,in_stack_fffffffffffffecc);
    internal::LogMessage::operator<<
              (this,(char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    internal::LogFinisher::operator=
              ((LogFinisher *)this,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    internal::LogMessage::~LogMessage((LogMessage *)0x499428);
    std::__cxx11::string::string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

string GetCapitalizedType(const FieldDescriptor* field) {
  switch (field->type()) {
    case FieldDescriptor::TYPE_INT32:
      return "Int32";
    case FieldDescriptor::TYPE_UINT32:
      return "UInt32";
    case FieldDescriptor::TYPE_SINT32:
      return "SInt32";
    case FieldDescriptor::TYPE_FIXED32:
      return "Fixed32";
    case FieldDescriptor::TYPE_SFIXED32:
      return "SFixed32";
    case FieldDescriptor::TYPE_INT64:
      return "Int64";
    case FieldDescriptor::TYPE_UINT64:
      return "UInt64";
    case FieldDescriptor::TYPE_SINT64:
      return "SInt64";
    case FieldDescriptor::TYPE_FIXED64:
      return "Fixed64";
    case FieldDescriptor::TYPE_SFIXED64:
      return "SFixed64";
    case FieldDescriptor::TYPE_FLOAT:
      return "Float";
    case FieldDescriptor::TYPE_DOUBLE:
      return "Double";
    case FieldDescriptor::TYPE_BOOL:
      return "Bool";
    case FieldDescriptor::TYPE_STRING:
      return "String";
    case FieldDescriptor::TYPE_BYTES:
      return "Bytes";
    case FieldDescriptor::TYPE_ENUM:
      return "Enum";
    case FieldDescriptor::TYPE_GROUP:
      return "Group";
    case FieldDescriptor::TYPE_MESSAGE:
      return "Message";
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return string();
}